

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

int __thiscall
Fl_Text_Buffer::search_forward
          (Fl_Text_Buffer *this,int startPos,char *searchString,int *foundPos,int matchCase)

{
  int *__s1;
  int iVar1;
  int iVar2;
  uint ucs;
  uint ucs_00;
  char *__s2;
  uint s;
  uint b;
  int l_1;
  int l;
  char c;
  char *sp;
  int bp;
  int matchCase_local;
  int *foundPos_local;
  char *searchString_local;
  Fl_Text_Buffer *pFStack_18;
  int startPos_local;
  Fl_Text_Buffer *this_local;
  
  if (searchString != (char *)0x0) {
    sp._4_4_ = matchCase;
    _bp = foundPos;
    foundPos_local = (int *)searchString;
    searchString_local._4_4_ = startPos;
    pFStack_18 = this;
    if (matchCase == 0) {
      sp._4_4_ = 0;
      for (; iVar2 = searchString_local._4_4_, iVar1 = length(this), iVar2 < iVar1;
          searchString_local._4_4_ = next_char(this,searchString_local._4_4_)) {
        sp._0_4_ = searchString_local._4_4_;
        _l = foundPos_local;
        while( true ) {
          if ((char)*_l == '\0') {
            *_bp = searchString_local._4_4_;
            return 1;
          }
          ucs = char_at(this,(int)sp);
          ucs_00 = fl_utf8decode((char *)_l,(char *)0x0,(wchar_t *)&s);
          iVar2 = fl_tolower(ucs);
          iVar1 = fl_tolower(ucs_00);
          if (iVar2 != iVar1) break;
          _l = (int *)((long)_l + (long)(int)s);
          sp._0_4_ = next_char(this,(int)sp);
        }
      }
    }
    else {
      for (; iVar2 = searchString_local._4_4_, iVar1 = length(this), iVar2 < iVar1;
          searchString_local._4_4_ = next_char(this,searchString_local._4_4_)) {
        sp._0_4_ = searchString_local._4_4_;
        _l = foundPos_local;
        while( true ) {
          l_1._3_1_ = (char)*_l;
          if (l_1._3_1_ == '\0') {
            *_bp = searchString_local._4_4_;
            return 1;
          }
          b = fl_utf8len1(l_1._3_1_);
          __s1 = _l;
          __s2 = address(this,(int)sp);
          iVar2 = memcmp(__s1,__s2,(long)(int)b);
          if (iVar2 != 0) break;
          _l = (int *)((long)_l + (long)(int)b);
          sp._0_4_ = b + (int)sp;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Fl_Text_Buffer::search_forward(int startPos, const char *searchString,
				   int *foundPos, int matchCase) const 
{
  IS_UTF8_ALIGNED2(this, (startPos))
  IS_UTF8_ALIGNED(searchString)
  
  if (!searchString)
    return 0;
  int bp;
  const char *sp;
  if (matchCase) {
    while (startPos < length()) {
      bp = startPos;
      sp = searchString;
      for (;;) {
        char c = *sp;
        // we reached the end of the "needle", so we found the string!
        if (!c) {
          *foundPos = startPos;
          return 1;
        }
        int l = fl_utf8len1(c);
        if (memcmp(sp, address(bp), l))
          break;
        sp += l; bp += l;
      }
      startPos = next_char(startPos);
    }
  } else {
    while (startPos < length()) {
      bp = startPos;
      sp = searchString;
      for (;;) {
        // we reached the end of the "needle", so we found the string!
        if (!*sp) {
          *foundPos = startPos;
          return 1;
        }
        int l;
        unsigned int b = char_at(bp);
        unsigned int s = fl_utf8decode(sp, 0, &l);
        if (fl_tolower(b)!=fl_tolower(s))
          break;
        sp += l; 
        bp = next_char(bp);
      }
      startPos = next_char(startPos);
    }
  }  
  return 0;
}